

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinholecamera.hpp
# Opt level: O2

void __thiscall PinholeCamera::PinholeCamera(PinholeCamera *this,Json *conf)

{
  undefined1 *b;
  vec3f *a;
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  float fVar6;
  vec3f vVar7;
  float local_58;
  float fStack_54;
  vec3f local_40;
  vec3f local_30;
  
  Camera::Camera(&this->super_Camera,conf);
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR_sampleray_00160d08;
  b = &(this->super_Camera).field_0x3c;
  (this->lefthalf).z = 0.0;
  *(undefined8 *)&(this->super_Camera).field_0x3c = 0;
  *(undefined8 *)&this->field_0x44 = 0;
  (this->uphalf).y = 0.0;
  (this->uphalf).z = 0.0;
  (this->lefthalf).x = 0.0;
  (this->lefthalf).y = 0.0;
  vVar7 = operator-(&(this->super_Camera).look_at,&(this->super_Camera).position);
  local_40.z = vVar7.z;
  local_40._0_8_ = vVar7._0_8_;
  vVar7 = normalized(&local_40);
  *(long *)&(this->super_Camera).field_0x3c = vVar7._0_8_;
  *(float *)&this->field_0x44 = vVar7.z;
  a = &(this->super_Camera).up;
  vVar7 = cross(a,(vec3f *)b);
  local_30.z = vVar7.z;
  local_30._0_8_ = vVar7._0_8_;
  vVar7 = cross((vec3f *)b,&local_30);
  local_40.z = vVar7.z;
  local_40._0_8_ = vVar7._0_8_;
  vVar7 = normalized(&local_40);
  (this->super_Camera).up.x = (float)(int)vVar7._0_8_;
  (this->super_Camera).up.y = (float)(int)((ulong)vVar7._0_8_ >> 0x20);
  (this->super_Camera).up.z = vVar7.z;
  fVar6 = *(float *)&(this->super_Camera).field_0x3c;
  fVar1 = *(float *)&this->field_0x40;
  fVar2 = *(float *)&this->field_0x44;
  iVar3 = (this->super_Camera).resy;
  iVar4 = (this->super_Camera).resx;
  dVar5 = tan((double)((this->super_Camera).fov * 0.5));
  vVar7 = operator*((float)(dVar5 * (double)(((float)iVar3 *
                                             SQRT(fVar2 * fVar2 + fVar6 * fVar6 + fVar1 * fVar1)) /
                                            (float)iVar4)),a);
  (this->uphalf).x = (float)(int)vVar7._0_8_;
  (this->uphalf).y = (float)(int)((ulong)vVar7._0_8_ >> 0x20);
  (this->uphalf).z = vVar7.z;
  vVar7 = cross(a,(vec3f *)b);
  dVar5 = tan((double)((this->super_Camera).fov * 0.5));
  fVar6 = (float)dVar5;
  local_58 = vVar7.x;
  fStack_54 = vVar7.y;
  (this->lefthalf).x = fVar6 * local_58;
  (this->lefthalf).y = fVar6 * fStack_54;
  (this->lefthalf).z = vVar7.z * fVar6;
  if ((this->super_Camera).mirror == true) {
    vVar7 = operator-(&this->lefthalf);
    (this->lefthalf).x = (float)(int)vVar7._0_8_;
    (this->lefthalf).y = (float)(int)((ulong)vVar7._0_8_ >> 0x20);
    (this->lefthalf).z = vVar7.z;
  }
  return;
}

Assistant:

PinholeCamera(const Json& conf): Camera(conf) {
		dir = normalized(look_at - position);
		up = normalized(cross(dir, cross(up, dir)));
		uphalf = norm(dir) * resy / resx * tan(fov/2) * up;
		lefthalf = cross(up, dir) * tan(fov/2);
		if (mirror) lefthalf = -lefthalf;
	}